

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_priority_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int32_t stream_id;
  int iVar1;
  nghttp2_stream *pnVar2;
  
  if ((session->pending_no_rfc7540_priorities == '\x01') &&
     (session->fallback_rfc7540_priorities == '\0')) {
    __assert_fail("!session_no_rfc7540_pri_no_fallback(session)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x1175,
                  "int nghttp2_session_on_priority_received(nghttp2_session *, nghttp2_frame *)");
  }
  iVar1 = (frame->hd).stream_id;
  if (iVar1 == 0) {
    iVar1 = session_handle_invalid_connection(session,frame,-0x1f9,"PRIORITY: stream_id == 0");
    return iVar1;
  }
  if ((frame->priority).pri_spec.stream_id != iVar1) {
    if (session->server != '\0') {
      pnVar2 = (nghttp2_stream *)nghttp2_map_find(&session->streams,iVar1);
      if (pnVar2 == (nghttp2_stream *)0x0) {
        stream_id = (frame->hd).stream_id;
        iVar1 = session_detect_idle_stream(session,stream_id);
        if (iVar1 == 0) {
          return 0;
        }
        pnVar2 = nghttp2_session_open_stream
                           (session,stream_id,'\0',&(frame->priority).pri_spec,NGHTTP2_STREAM_IDLE,
                            (void *)0x0);
        if (pnVar2 == (nghttp2_stream *)0x0) {
          return -0x385;
        }
        iVar1 = nghttp2_session_adjust_idle_stream(session);
      }
      else {
        iVar1 = nghttp2_session_reprioritize_stream(session,pnVar2,&(frame->priority).pri_spec);
        if (iVar1 < -900) {
          return iVar1;
        }
        iVar1 = nghttp2_session_adjust_idle_stream(session);
      }
      if (iVar1 < -900) {
        return iVar1;
      }
    }
    iVar1 = session_call_on_frame_received(session,frame);
    return iVar1;
  }
  iVar1 = nghttp2_session_terminate_session_with_reason(session,1,"depend on itself");
  return iVar1;
}

Assistant:

int nghttp2_session_on_priority_received(nghttp2_session *session,
                                         nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;

  assert(!session_no_rfc7540_pri_no_fallback(session));

  if (frame->hd.stream_id == 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "PRIORITY: stream_id == 0");
  }

  if (frame->priority.pri_spec.stream_id == frame->hd.stream_id) {
    return nghttp2_session_terminate_session_with_reason(
        session, NGHTTP2_PROTOCOL_ERROR, "depend on itself");
  }

  if (!session->server) {
    /* Re-prioritization works only in server */
    return session_call_on_frame_received(session, frame);
  }

  stream = nghttp2_session_get_stream_raw(session, frame->hd.stream_id);

  if (!stream) {
    /* PRIORITY against idle stream can create anchor node in
       dependency tree. */
    if (!session_detect_idle_stream(session, frame->hd.stream_id)) {
      return 0;
    }

    stream = nghttp2_session_open_stream(
        session, frame->hd.stream_id, NGHTTP2_STREAM_FLAG_NONE,
        &frame->priority.pri_spec, NGHTTP2_STREAM_IDLE, NULL);

    if (stream == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    rv = nghttp2_session_adjust_idle_stream(session);
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  } else {
    rv = nghttp2_session_reprioritize_stream(session, stream,
                                             &frame->priority.pri_spec);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    rv = nghttp2_session_adjust_idle_stream(session);
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }

  return session_call_on_frame_received(session, frame);
}